

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

void __thiscall
GCPtr<symbols::FunctionObject>::GCPtr(GCPtr<symbols::FunctionObject> *this,FunctionObject *t)

{
  bool bVar1;
  pointer pGVar2;
  undefined1 local_40 [8];
  GCInfo<symbols::FunctionObject> gcObj;
  _List_iterator<GCInfo<symbols::FunctionObject>_> local_20;
  iterator p;
  FunctionObject *t_local;
  GCPtr<symbols::FunctionObject> *this_local;
  
  p._M_node = (_List_node_base *)t;
  if (first) {
    atexit(shutdown);
  }
  first = false;
  std::_List_iterator<GCInfo<symbols::FunctionObject>_>::_List_iterator(&local_20);
  local_20._M_node = (_List_node_base *)findPtrInfo(this,p._M_node);
  gcObj.memPtr = (FunctionObject *)
                 std::__cxx11::
                 list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>
                 ::end(&gclist_abi_cxx11_);
  bVar1 = std::operator==(&local_20,(_Self *)&gcObj.memPtr);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    GCInfo<symbols::FunctionObject>::GCInfo
              ((GCInfo<symbols::FunctionObject> *)local_40,(FunctionObject *)p._M_node);
    std::__cxx11::
    list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>::
    push_front(&gclist_abi_cxx11_,(value_type *)local_40);
  }
  else {
    pGVar2 = std::_List_iterator<GCInfo<symbols::FunctionObject>_>::operator->(&local_20);
    pGVar2->refcount = pGVar2->refcount + 1;
  }
  this->addr = (FunctionObject *)p._M_node;
  return;
}

Assistant:

GCPtr(T *t=nullptr){

        if(first) atexit(shutdown);
        first = false;

        typename list<GCInfo<T>>::iterator p;
        p = findPtrInfo(t);

        if(p != gclist.end())
            p->refcount++;
        else{

            GCInfo<T> gcObj(t);
            gclist.push_front(gcObj);
        }
        addr = t;
        #ifdef DISPLAY
           cout << "Constructing GCPtr. " << endl;
        #endif
    }